

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log_Scope.h
# Opt level: O2

Log_Entry * __thiscall
Nova::Log::Log_Scope::Get_New_Scope
          (Log_Scope *this,Log_Class *instance,string *new_scope_identifier,string *new_name)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  pointer ppLVar1;
  pointer ppLVar2;
  size_type sVar3;
  Log_Scope *this_01;
  mapped_type *pmVar4;
  void *unaff_R13;
  Log_Entry *new_entry;
  Log_Scope *local_30;
  
  (this->super_Log_Entry).end_on_separate_line = true;
  (this->super_Log_Entry).log_file_end_on_separate_line = true;
  this_00 = &this->entries;
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::count(this_00,new_scope_identifier);
  if (sVar3 == 0) {
    this_01 = (Log_Scope *)operator_new(0xc0);
    Log_Scope(this_01,&this->super_Log_Entry,(this->super_Log_Entry).depth + 1,
              (this->super_Log_Entry).timer_id,new_scope_identifier,new_name,
              (this->super_Log_Entry).verbosity_level);
    local_30 = this_01;
    std::vector<Nova::Log::Log_Entry_*,_std::allocator<Nova::Log::Log_Entry_*>_>::push_back
              (&(this->children)._data,(value_type *)&local_30);
    ppLVar1 = (this->children)._data.
              super__Vector_base<Nova::Log::Log_Entry_*,_std::allocator<Nova::Log::Log_Entry_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppLVar2 = (this->children)._data.
              super__Vector_base<Nova::Log::Log_Entry_*,_std::allocator<Nova::Log::Log_Entry_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](this_00,new_scope_identifier);
    *pmVar4 = (mapped_type)((ulong)((long)ppLVar1 - (long)ppLVar2) >> 3);
    return &local_30->super_Log_Entry;
  }
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](this_00,new_scope_identifier);
  operator_delete(unaff_R13);
  _Unwind_Resume(pmVar4);
}

Assistant:

Log_Entry* Get_New_Scope(Log_Class& instance,const std::string& new_scope_identifier,const std::string& new_name)
    {
        int entry;end_on_separate_line=true;log_file_end_on_separate_line=true;
        if(entries.count(new_scope_identifier)!=0 && entries[new_scope_identifier]==entry){children(entry)->name=new_name;return children(entry);}
        Log_Entry* new_entry=new Log_Scope(this,depth+1,timer_id,new_scope_identifier,new_name,verbosity_level);
        children.Append(new_entry);
        entries[new_scope_identifier]=(int)children.size();
        return new_entry;
    }